

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Texture *this;
  Texture **this_00;
  int iVar1;
  uint uVar2;
  MeshData *meshData;
  long lVar3;
  undefined1 local_3c8 [8];
  GamepadInputHandler gamepad1;
  Text fpsCounter;
  string local_258;
  undefined7 local_238;
  undefined1 uStack_231;
  GamepadState lastGamepad1State;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_208;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  undefined1 auStack_160 [8];
  Image woodImage;
  Application app;
  Triangle triangle;
  Mesh mesh;
  Image grayBrickImage;
  Texture grayBrickTexture;
  Texture woodTexture;
  Texture houseTexture;
  
  printf("Application started!");
  putchar(10);
  fflush(_stdout);
  Application::Application((Application *)&woodImage.texture);
  std::__cxx11::string::string
            ((string *)&local_258,"GLEX Graphics Example",
             (allocator *)(gamepad1._gamepadName.field_2._M_local_buf + 8));
  Application::createWindow((Application *)&woodImage.texture,&local_258,0x280,0x1e0);
  std::__cxx11::string::~string((string *)&local_258);
  lastGamepad1State.buttons[0] = '\0';
  lastGamepad1State.buttons[1] = '\0';
  lastGamepad1State.buttons[2] = '\0';
  lastGamepad1State.buttons[3] = '\0';
  lastGamepad1State.buttons[4] = '\0';
  lastGamepad1State.buttons[5] = '\0';
  lastGamepad1State.buttons[6] = '\0';
  local_238 = 0;
  uStack_231 = 0;
  lastGamepad1State.buttons[8] = '\0';
  lastGamepad1State.buttons[9] = '\0';
  lastGamepad1State.buttons[10] = '\0';
  lastGamepad1State.buttons[0xb] = '\0';
  lastGamepad1State.buttons[0xc] = '\0';
  lastGamepad1State.buttons[0xd] = '\0';
  lastGamepad1State.buttons[0xe] = '\0';
  lastGamepad1State._15_1_ = 0;
  lastGamepad1State.analog[0] = 0.0;
  lastGamepad1State.analog[1] = 0.0;
  lastGamepad1State.analog[2] = 0.0;
  lastGamepad1State.analog[3] = 0.0;
  GamepadInputHandler::GamepadInputHandler((GamepadInputHandler *)local_3c8,'\0');
  fpsCounter._200_8_ = &woodImage.texture;
  std::function<void_(GamepadState)>::operator=
            ((function<void_(GamepadState)> *)&gamepad1._gamepadIndex,
             (function<void_(GamepadState)> *)&fpsCounter._texture._height);
  std::_Function_base::~_Function_base((_Function_base *)&fpsCounter._texture._height);
  std::__shared_ptr<GamepadInputHandler,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<GamepadInputHandler,void>
            ((__shared_ptr<GamepadInputHandler,(__gnu_cxx::_Lock_policy)2> *)
             (gamepad1._gamepadName.field_2._M_local_buf + 8),(GamepadInputHandler *)local_3c8);
  lastGamepad1State.analog[4] = (float)gamepad1._gamepadName.field_2._8_4_;
  lastGamepad1State.analog[5] = (float)gamepad1._gamepadName.field_2._12_4_;
  _Stack_208._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)fpsCounter._0_8_;
  gamepad1._gamepadName.field_2._8_8_ = 0;
  fpsCounter.x = 0.0;
  fpsCounter.y = 0.0;
  Application::addInputHandler
            ((Application *)&woodImage.texture,
             (shared_ptr<InputHandler> *)(lastGamepad1State.analog + 4));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fpsCounter);
  stack0xffffffffffffffa4 = 0;
  grayBrickTexture.id = 0;
  std::__cxx11::string::string
            ((string *)&local_200,"images/gray_brick_512.jpg",
             (allocator *)(gamepad1._gamepadName.field_2._M_local_buf + 8));
  this = (Texture *)((long)&grayBrickImage.texture + 4);
  Texture::loadRGB(this,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  mesh._36_4_ = (BADTYPE)(int)app._windowName.field_2._12_4_;
  grayBrickImage.y = (float)(int)app._windowName.field_2._8_4_;
  grayBrickImage.height = 0.0;
  grayBrickImage.windowScale = 0.0;
  mesh._scale = 0.0;
  grayBrickImage.x = -100.0;
  grayBrickImage.width = woodImage.texture._0_4_;
  grayBrickTexture._width = 0;
  grayBrickTexture._height = 0;
  grayBrickImage.rotationX = 1.0;
  woodTexture.id = 0;
  grayBrickImage.z = (float)mesh._36_4_;
  grayBrickImage._32_8_ = this;
  std::__cxx11::string::string
            ((string *)&local_1e0,"images/wood1.bmp",
             (allocator *)(gamepad1._gamepadName.field_2._M_local_buf + 8));
  Texture::loadRGB((Texture *)&grayBrickTexture._width,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  woodImage.height = 0.0;
  woodImage.windowScale = 0.0;
  auStack_160._0_4_ = 250.0;
  auStack_160._4_4_ = 420.0;
  woodImage.x = 10.0;
  woodImage.y = 100.0;
  woodImage.z = 100.0;
  woodImage.width = woodImage.texture._0_4_;
  woodImage.rotationX = 1.0;
  triangle.height = 0.0;
  triangle.windowScale = 0.0;
  stack0xffffffffffffff24 = 0x435c0000437a0000;
  triangle.x = 10.0;
  triangle.y = 100.0;
  triangle.z = 100.0;
  triangle.width = woodImage.texture._0_4_;
  triangle.rotationX = 1.0;
  woodImage._32_8_ = &grayBrickTexture._width;
  std::__cxx11::string::string
            ((string *)&local_1c0,"meshes/house.obj",
             (allocator *)(gamepad1._gamepadName.field_2._M_local_buf + 8));
  meshData = MeshLoader::loadObjMesh(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  woodTexture._width = 0;
  woodTexture._height = 0;
  houseTexture.id = 0;
  std::__cxx11::string::string
            ((string *)&local_1a0,"images/house_512.png",
             (allocator *)(gamepad1._gamepadName.field_2._M_local_buf + 8));
  Texture::loadRGBA((Texture *)&woodTexture._width,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  Mesh::Mesh((Mesh *)&triangle.rotationY,meshData,(Texture *)&woodTexture._width,0.3);
  houseTexture._width = (GLsizei)woodImage.texture._0_4_;
  std::__cxx11::string::string
            ((string *)&local_180,"",(allocator *)((long)&houseTexture._height + 3));
  Text::Text((Text *)((long)&gamepad1._gamepadName.field_2 + 8),
             (uint)(1.0 < (float)houseTexture._width),&local_180,(FontColor)0x940115,20.0,20.0,100.0
             ,woodImage.texture._0_4_,1.0,0.0);
  std::__cxx11::string::~string((string *)&local_180);
  Text::createTexture((Text *)((long)&gamepad1._gamepadName.field_2 + 8));
  printf("\n\nPress L + R + Start to exit...");
  putchar(10);
  fflush(_stdout);
  this_00 = &woodImage.texture;
  while( true ) {
    iVar1 = Application::windowShouldClose((Application *)this_00);
    if (iVar1 != 0) break;
    nbFrames = nbFrames + 1;
    currentTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    lVar3 = ((long)currentTime.__d.__r - (long)lastTime.__d.__r) / 1000000;
    timeDiff = (uint16_t)lVar3;
    uVar2 = (uint)lVar3;
    if (999 < (uVar2 & 0xfff8)) {
      fps = nbFrames;
      frameTime = (float)(uVar2 & 0xffff) / (float)nbFrames;
      nbFrames = 0;
      lastTime.__d.__r = currentTime.__d.__r;
    }
    Application::handleInput((Application *)this_00);
    Application::clear((Application *)this_00);
    Application::reshapeOrtho((Application *)this_00,1.0);
    Image::draw((Image *)&mesh._scale);
    Application::reshapeFrustum((Application *)this_00);
    Mesh::draw((Mesh *)&triangle.rotationY);
    triangle.rotationY = triangle.rotationY + 0.75;
    triangle.scale = triangle.scale + 0.75;
    mesh.rotationX = mesh.rotationX + 0.75;
    Application::reshapeOrtho((Application *)this_00,1.0);
    Image::draw((Image *)auStack_160);
    Triangle::draw((Triangle *)
                   ((long)&app._inputHandlers.
                           super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    Application::reshapeOrtho((Application *)this_00,fpsCounter.rotationX);
    snprintf(main::outputString,0x32,"frame time: %.2f ms  fps: %d",SUB84((double)frameTime,0),
             (ulong)fps);
    std::__cxx11::string::assign((char *)&fpsCounter.scale);
    Text::draw((Text *)((long)&gamepad1._gamepadName.field_2 + 8));
    Application::swapBuffers((Application *)this_00);
  }
  Application::closeWindow((Application *)&woodImage.texture);
  Text::~Text((Text *)((long)&gamepad1._gamepadName.field_2 + 8));
  Texture::~Texture((Texture *)&woodTexture._width);
  Texture::~Texture((Texture *)&grayBrickTexture._width);
  Texture::~Texture((Texture *)((long)&grayBrickImage.texture + 4));
  GamepadInputHandler::~GamepadInputHandler((GamepadInputHandler *)local_3c8);
  Application::~Application((Application *)&woodImage.texture);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    DEBUG_PRINTLN("Application started!");
    int width = 640;
    int height = 480;
    Application app;
    app.createWindow("GLEX Graphics Example", width, height);

    // Basic gamepad handling
    GamepadState lastGamepad1State;
    GamepadInputHandler gamepad1(GamepadIndex::FIRST);
    gamepad1.registerRawStateCallback([&app, &lastGamepad1State](GamepadState gamepadState) {
        // Store last state
        lastGamepad1State = gamepadState;

        // Check for L + R + Start button combo to exit the app
        if (gamepadState.analog[GamepadAnalog::L_TRIGGER] > 0.9 && gamepadState.analog[GamepadAnalog::R_TRIGGER] > 0.9 && gamepadState.buttons[GamepadButton::START] == GamepadButtonState::PRESSED) {
            DEBUG_PRINTLN("L + R + Start pressed!");
            cleanExit(&app);
        }
    });
    app.addInputHandler(std::shared_ptr<GamepadInputHandler>(&gamepad1));

    // NOTE: Both Image and Mesh classes can use textures loaded from JPG, PNG, or BMP.
    //       All PNG files have been run through pngcrush.
    //
    //       I have not yet done profiling to determine the performance and memory 
    //       implications of using each file format. However keep in mind that only PNG
    //       fully supports RGBA as the others do not have alpha channels. The below test
    //       code demostrates loading all 3 types. You can also change the extensions to 
    //       try the other formats yourself for testing/profiling. 
    //
    //       In my limited testing with dcload only, the file size seems to have a much larger
    //       impact on loading time than the format. So I found JPG files load significantly
    //       faster than either PNG or BMP with no noticeable loss in quality (though no alpha).

    Texture grayBrickTexture;
    grayBrickTexture.loadRGB("images/gray_brick_512.jpg");
    Image grayBrickImage(&grayBrickTexture, 0, (float)app.windowHeight(), Image::Z_BACKGROUND, (float)app.windowWidth(), (float)app.windowHeight(), app.screenScale);

    Texture woodTexture;
    woodTexture.loadRGB("images/wood1.bmp");
    Image woodImage(&woodTexture, 250, 420, 10, Image::Z_HUD, 100, app.screenScale);

    Triangle triangle(250, 220, 10, Image::Z_HUD, 100, app.screenScale);

    MeshData *houseMesh = MeshLoader::loadObjMesh("meshes/house.obj");
    Texture houseTexture;
    houseTexture.loadRGBA("images/house_512.png");
    Mesh mesh(houseMesh, &houseTexture, 0.3f);

    Cube cube;

    FontColor darkBlue{21, 1, 148};
    FontFace fontFace = app.screenScale > 1.0 ? FontFace::arial_28 : FontFace::arial_16;
    Text fpsCounter(fontFace, "", darkBlue, 20, 20, Image::Z_HUD, app.screenScale);
    fpsCounter.createTexture();

#ifdef DREAMCAST
    // Init perf counter
    PMCR_Init(PERF_COUNTER_WHICH, PMCR_ELAPSED_TIME_MODE, PMCR_COUNT_CPU_CYCLES);
    lastTimeMs = PMCR_Read(PERF_COUNTER_WHICH) / PERF_COUNTER_NS_TO_MS;
#endif

    DEBUG_PRINTLN("\n\nPress L + R + Start to exit...");

    // Main loop
    while (!app.windowShouldClose()) {
        // Measure speed
        nbFrames++;

#ifdef DREAMCAST
        currentTimeMs = PMCR_Read(PERF_COUNTER_WHICH) / PERF_COUNTER_NS_TO_MS;
        timeDiff = currentTimeMs - lastTimeMs;
        if (timeDiff >= 1000) {
            frameTime = float(timeDiff) / float(nbFrames);
            fps = nbFrames;
            nbFrames = 0;
            lastTimeMs = currentTimeMs;
        }
#else
        currentTime = std::chrono::high_resolution_clock::now();
        timeDiff = (uint16_t)std::chrono::duration_cast<std::chrono::milliseconds>(currentTime - lastTime).count();
        if (timeDiff >= 1000) {
            frameTime = float(timeDiff) / float(nbFrames);
            fps = nbFrames;
            nbFrames = 0;
            lastTime = currentTime;
        }
#endif

        // Handle input
        app.handleInput();

        // Clear the buffer to draw the prepare frame
        app.clear();

        // Draw the background image
        app.reshapeOrtho(1.0);        
        grayBrickImage.draw();

        // Draw the 3d rotating house
        app.reshapeFrustum();
        mesh.draw();
        mesh.rotationX += 0.75;
        mesh.rotationY += 0.75;
        mesh.rotationZ += 0.75;
        // cube.draw();

        // Draw the foreground 2d image
        app.reshapeOrtho(1.0);
        woodImage.draw();
        triangle.draw();

        // Draw the FPS counter HUD text
        app.reshapeOrtho(fpsCounter.scale);
        static char outputString[50];
        snprintf(&outputString[0], 50, "frame time: %.2f ms  fps: %d", frameTime, fps);
        fpsCounter.text = outputString;
        fpsCounter.draw();

        // Swap buffers to display the current frame
        app.swapBuffers();
    }

    cleanExit(&app);
}